

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O2

void __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::calcEdgeLogDerivativesStates
          (BeagleCPUImpl<float,_1,_0> *this,int *tipStates,float *preOrderPartial,
          int firstDerivativeIndex,int secondDerivativeIndex,double *categoryRates,
          float *categoryWeights,double *outDerivatives,double *outSumDerivatives,
          double *outSumSquaredDerivatives)

{
  float fVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  ulong uVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  float *pfVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  undefined1 auVar16 [16];
  
  uVar2 = this->kPatternCount;
  uVar3 = this->kCategoryCount;
  lVar13 = 0;
  pfVar5 = this->gTransitionMatrices[firstDerivativeIndex];
  for (uVar14 = 0; uVar14 != (~((int)uVar3 >> 0x1f) & uVar3); uVar14 = uVar14 + 1) {
    lVar15 = (long)this->kPartialsPaddedStateCount;
    uVar4 = this->kStateCount;
    pfVar6 = this->grandNumeratorDerivTmp;
    pfVar7 = this->grandDenominatorDerivTmp;
    pfVar12 = (float *)(lVar13 * lVar15 + (long)preOrderPartial);
    for (uVar11 = 0; uVar11 != (~((int)uVar2 >> 0x1f) & uVar2); uVar11 = uVar11 + 1) {
      auVar16 = ZEXT816(0) << 0x40;
      fVar1 = preOrderPartial
              [(uVar14 * (long)(int)uVar2 + uVar11) * lVar15 +
               (long)(tipStates[uVar11] % (int)uVar4)];
      iVar9 = this->kMatrixSize * (int)uVar14 + tipStates[uVar11];
      for (uVar8 = 0; (~((int)uVar4 >> 0x1f) & uVar4) != uVar8; uVar8 = uVar8 + 1) {
        lVar10 = (long)iVar9;
        iVar9 = iVar9 + this->kTransPaddedStateCount;
        auVar16 = vfmadd231ss_fma(auVar16,ZEXT416((uint)pfVar5[lVar10]),
                                  ZEXT416((uint)pfVar12[uVar8]));
      }
      pfVar12 = pfVar12 + lVar15;
      auVar16 = vfmadd213ss_fma(auVar16,ZEXT416((uint)categoryWeights[uVar14]),
                                ZEXT416((uint)pfVar6[uVar11]));
      pfVar6[uVar11] = auVar16._0_4_;
      auVar16 = vfmadd213ss_fma(ZEXT416((uint)fVar1),ZEXT416((uint)categoryWeights[uVar14]),
                                ZEXT416((uint)pfVar7[uVar11]));
      pfVar7[uVar11] = auVar16._0_4_;
    }
    lVar13 = lVar13 + (long)(int)uVar2 * 4;
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcEdgeLogDerivativesStates(const int *tipStates,
                                                                     const REALTYPE *preOrderPartial,
                                                                     const int firstDerivativeIndex,
                                                                     const int secondDerivativeIndex,
                                                                     const double *categoryRates,
                                                                     const REALTYPE *categoryWeights,
                                                                     double *outDerivatives,
                                                                     double *outSumDerivatives,
                                                                     double *outSumSquaredDerivatives) {

    const REALTYPE *firstDerivMatrix = gTransitionMatrices[firstDerivativeIndex];

    for (int category = 0; category < kCategoryCount; category++) {

        for (int pattern = 0; pattern < kPatternCount; pattern++) {

            const int patternIndex = category * kPatternCount + pattern;
            const int state = tipStates[pattern];

            REALTYPE numerator = 0.0;
            REALTYPE denominator = preOrderPartial[patternIndex * kPartialsPaddedStateCount + (state % kStateCount)];
            // TODO (state % kStateCount) is not correct; should imply missing character
            // TODO See calcCrossProductsStates() for possible solution

            for (int k = 0; k < kStateCount; k++) {
                numerator += firstDerivMatrix[category * kMatrixSize + k * kTransPaddedStateCount + state] *
                             preOrderPartial[patternIndex * kPartialsPaddedStateCount + k];
            }

            grandNumeratorDerivTmp[pattern] += categoryWeights[category] * numerator;
            grandDenominatorDerivTmp[pattern] += categoryWeights[category] * denominator;
        }
    }
}